

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

string * string_get_sortable_timestamp_abi_cxx11_(void)

{
  size_type *psVar1;
  undefined8 uVar2;
  long lVar3;
  tm *__tp;
  size_t sVar4;
  long *plVar5;
  undefined8 *puVar6;
  ulong *puVar7;
  string *in_RDI;
  ulong uVar8;
  char timestamp_ns [11];
  time_t as_time_t;
  char timestamp_no_ns [100];
  ulong *local_110;
  long local_108;
  ulong local_100;
  long lStack_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0 [2];
  char local_cb [11];
  long *local_c0 [2];
  long local_b0 [2];
  long local_a0;
  char local_98 [112];
  
  lVar3 = std::chrono::_V2::system_clock::now();
  local_a0 = lVar3 / 1000000000;
  __tp = localtime(&local_a0);
  strftime(local_98,100,"%Y_%m_%d-%H_%M_%S",__tp);
  snprintf(local_cb,0xb,"%09ld",lVar3 % 1000000000);
  local_c0[0] = local_b0;
  sVar4 = strlen(local_98);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,local_98,local_98 + sVar4);
  plVar5 = (long *)std::__cxx11::string::append((char *)local_c0);
  puVar7 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar7) {
    local_100 = *puVar7;
    lStack_f8 = plVar5[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar7;
    local_110 = (ulong *)*plVar5;
  }
  local_108 = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_f0 = local_e0;
  sVar4 = strlen(local_cb);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,local_cb,local_cb + sVar4);
  uVar8 = 0xf;
  if (local_110 != &local_100) {
    uVar8 = local_100;
  }
  if (uVar8 < (ulong)(local_e8 + local_108)) {
    uVar8 = 0xf;
    if (local_f0 != local_e0) {
      uVar8 = local_e0[0];
    }
    if ((ulong)(local_e8 + local_108) <= uVar8) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_110);
      goto LAB_001f4099;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_f0);
LAB_001f4099:
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  psVar1 = puVar6 + 2;
  if ((size_type *)*puVar6 == psVar1) {
    uVar2 = puVar6[3];
    (in_RDI->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&in_RDI->field_2 + 8) = uVar2;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)*puVar6;
    (in_RDI->field_2)._M_allocated_capacity = *psVar1;
  }
  in_RDI->_M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_f0 != local_e0) {
    operator_delete(local_f0,local_e0[0] + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_c0[0] != local_b0) {
    operator_delete(local_c0[0],local_b0[0] + 1);
  }
  return in_RDI;
}

Assistant:

std::string string_get_sortable_timestamp() {
    using clock = std::chrono::system_clock;

    const clock::time_point current_time = clock::now();
    const time_t as_time_t = clock::to_time_t(current_time);
    char timestamp_no_ns[100];
    std::strftime(timestamp_no_ns, 100, "%Y_%m_%d-%H_%M_%S", std::localtime(&as_time_t));

    const int64_t ns = std::chrono::duration_cast<std::chrono::nanoseconds>(
        current_time.time_since_epoch() % 1000000000).count();
    char timestamp_ns[11];
    snprintf(timestamp_ns, 11, "%09" PRId64, ns);

    return std::string(timestamp_no_ns) + "." + std::string(timestamp_ns);
}